

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O0

double __thiscall
FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope
          (FSAOHDist_NECOF *this,Scope *sfSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sfacIndices,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohIndices)

{
  uint uVar1;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *pvVar2;
  Index IVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  Scope *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long *in_RDI;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *pvVar6;
  double p_i;
  Index x;
  string s;
  stringstream ss;
  ENoSubScope *e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacIrestr;
  Index ohI;
  Index agI;
  Index i;
  double p;
  size_type in_stack_fffffffffffffd28;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *in_stack_fffffffffffffd30
  ;
  const_reference in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  Index in_stack_fffffffffffffd44;
  const_reference in_stack_fffffffffffffd48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd68;
  Scope *in_stack_fffffffffffffd70;
  Scope *old_sc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  uint local_34;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *local_30;
  
  pvVar6 = (vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
           (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI,in_RDX);
  local_34 = 0;
  local_30 = pvVar6;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
    if (sVar4 <= local_34) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    uVar1 = *pvVar5;
    this_00 = std::vector<Scope,_std::allocator<Scope>_>::at
                        ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->super_SDT);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9c9eda);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9c9f00);
    old_sc = in_RDX;
    indivIndices = in_RSI;
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (indivIndices,old_sc,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    in_stack_fffffffffffffd48 =
         std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::at
                   ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                    in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    IVar3 = IndexTools::IndividualToJointIndicesStepSize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (size_t *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd44 = IVar3;
    in_stack_fffffffffffffd38 =
         std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                   (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    (*(*in_stack_fffffffffffffd38)->_vptr_CPDDiscreteInterface[2])
              (*in_stack_fffffffffffffd38,(ulong)uVar1,(ulong)IVar3);
    local_30 = (vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
               ((double)pvVar6 * (double)local_30);
    pvVar2 = local_30;
    in_stack_fffffffffffffd30 = pvVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    pvVar6 = pvVar2;
    local_34 = local_34 + 1;
  }
  return (double)local_30;
}

Assistant:

double FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope(
        const Scope& sfSc, const std::vector<Index>& sfacIndices,
        const Scope& agSc, const std::vector<Index>& ohIndices
        ) const
{    
    double p = GetXProb(sfSc, sfacIndices);


    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI=agSc.at(i);
        Index ohI=ohIndices.at(i);

        vector<Index> sfacIrestr(_m_sfacSoI.at(agI).size());
        try{
            IndexTools::RestrictIndividualIndicesToNarrowerScope(
                sfacIndices, sfSc, _m_sfacSoI.at(agI), sfacIrestr );
        }catch(ENoSubScope& e)
        {
            stringstream ss;
            ss <<"Error FSAOHDist_NECOF::GetXOHProb_relT should be called with all state factors on which the observation histories (of the agents in agSc) depend\n";
            ss <<"sfSc="<<sfSc<<", agSc="<<agSc<<endl;
            string s(ss.str());
            cerr << s;
            throw ENoSubScope(s);
        }
        Index x = IndexTools::IndividualToJointIndicesStepSize(sfacIrestr, 
                _m_stepsize.at(agI) );

        double p_i = _m_oHistConditional.at(agI)->Get(ohI, x);
        p *= p_i;
    }

    return p;

}